

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_compile_commands.cxx
# Opt level: O0

void __thiscall CompileCommandParser::Next(CompileCommandParser *this)

{
  char cVar1;
  ulong uVar2;
  allocator local_31;
  string local_30;
  CompileCommandParser *local_10;
  CompileCommandParser *this_local;
  
  local_10 = this;
  cVar1 = std::istream::get();
  this->C = cVar1;
  uVar2 = std::ios::bad();
  if ((uVar2 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_30,"Unexpected end of file.",&local_31);
    ErrorExit(this,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  return;
}

Assistant:

void Next()
  {
    this->C = char(Input->get());
    if (this->Input->bad()) ErrorExit("Unexpected end of file.");
  }